

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetupScrollFreeze(int columns,int rows)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImGuiTable *pIVar3;
  char *pcVar4;
  ImGuiTableColumn *pIVar5;
  ulong uVar6;
  char *pcVar7;
  char cVar8;
  uint uVar9;
  long lVar10;
  ImGuiTableColumn *pIVar11;
  ImGuiTableColumnIdx IVar12;
  char *pcVar13;
  ImGuiTableColumn *pIVar14;
  ImGuiTableColumnIdx IVar15;
  
  pIVar3 = GImGui->CurrentTable;
  if (pIVar3 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableSetupColumn() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x5bf,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if (pIVar3->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false && \"Need to call TableSetupColumn() before first row!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x5c0,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if (0x3f < (uint)columns) {
    __assert_fail("columns >= 0 && columns < 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x5c1,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if (0x7f < (uint)rows) {
    __assert_fail("rows >= 0 && rows < 128",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                  ,0x5c2,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  uVar9 = 0;
  if ((((uint)pIVar3->Flags >> 0x18 & 1) != 0) &&
     (uVar9 = pIVar3->ColumnsCount, columns < pIVar3->ColumnsCount)) {
    uVar9 = columns;
  }
  cVar8 = (char)uVar9;
  pIVar3->FreezeColumnsRequest = cVar8;
  pIVar1 = &pIVar3->InnerWindow->Scroll;
  IVar15 = '\0';
  if (pIVar1->x != 0.0) {
    IVar15 = cVar8;
  }
  if (NAN(pIVar1->x)) {
    IVar15 = cVar8;
  }
  pIVar3->FreezeColumnsCount = IVar15;
  if (((uint)pIVar3->Flags >> 0x19 & 1) == 0) {
    rows = 0;
  }
  IVar12 = (ImGuiTableColumnIdx)rows;
  pIVar3->FreezeRowsRequest = IVar12;
  pfVar2 = &(pIVar3->InnerWindow->Scroll).y;
  IVar15 = '\0';
  if (*pfVar2 != 0.0) {
    IVar15 = IVar12;
  }
  if (NAN(*pfVar2)) {
    IVar15 = IVar12;
  }
  pIVar3->FreezeRowsCount = IVar15;
  pIVar3->IsUnfrozenRows = IVar15 == '\0';
  if ('\0' < cVar8) {
    uVar6 = 0;
    do {
      pcVar13 = (pIVar3->DisplayOrderToIndex).Data;
      pcVar4 = (pIVar3->DisplayOrderToIndex).DataEnd;
      pcVar7 = pcVar13 + uVar6;
      if (pcVar4 <= pcVar7) {
LAB_001d8ad0:
        pcVar7 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_001d8afc:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                      ,0x24a,pcVar7);
      }
      cVar8 = *pcVar7;
      if ((char)uVar9 <= cVar8 && uVar6 != (uint)(int)cVar8) {
        pcVar13 = pcVar13 + cVar8;
        if (pcVar13 < pcVar4) {
          lVar10 = (long)*pcVar13;
          if (-1 < lVar10) {
            pIVar14 = (pIVar3->Columns).Data;
            pIVar5 = (pIVar3->Columns).DataEnd;
            pIVar11 = pIVar14 + lVar10;
            if ((pIVar11 < pIVar5) && (pIVar14 = pIVar14 + cVar8, pIVar14 < pIVar5)) {
              IVar15 = pIVar11->DisplayOrder;
              pIVar11->DisplayOrder = pIVar14->DisplayOrder;
              pIVar14->DisplayOrder = IVar15;
              pcVar7 = (pIVar3->DisplayOrderToIndex).Data;
              pcVar13 = pcVar7 + cVar8;
              if (pcVar13 < (pIVar3->DisplayOrderToIndex).DataEnd) {
                cVar8 = *pcVar13;
                *pcVar13 = pcVar7[uVar6];
                pcVar7[uVar6] = cVar8;
                uVar9 = (uint)(byte)pIVar3->FreezeColumnsRequest;
                goto LAB_001d8abe;
              }
              goto LAB_001d8ad0;
            }
          }
          pcVar7 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
          goto LAB_001d8afc;
        }
        goto LAB_001d8ad0;
      }
LAB_001d8abe:
      uVar6 = uVar6 + 1;
    } while ((long)uVar6 < (long)(char)uVar9);
  }
  return;
}

Assistant:

void ImGui::TableSetupScrollFreeze(int columns, int rows)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call TableSetupColumn() before first row!");
    IM_ASSERT(columns >= 0 && columns < IMGUI_TABLE_MAX_COLUMNS);
    IM_ASSERT(rows >= 0 && rows < 128); // Arbitrary limit

    table->FreezeColumnsRequest = (table->Flags & ImGuiTableFlags_ScrollX) ? (ImGuiTableColumnIdx)ImMin(columns, table->ColumnsCount) : 0;
    table->FreezeColumnsCount = (table->InnerWindow->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->FreezeRowsRequest = (table->Flags & ImGuiTableFlags_ScrollY) ? (ImGuiTableColumnIdx)rows : 0;
    table->FreezeRowsCount = (table->InnerWindow->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->IsUnfrozenRows = (table->FreezeRowsCount == 0); // Make sure this is set before TableUpdateLayout() so ImGuiListClipper can benefit from it.b

    // Ensure frozen columns are ordered in their section. We still allow multiple frozen columns to be reordered.
    // FIXME-TABLE: This work for preserving 2143 into 21|43. How about 4321 turning into 21|43? (preserve relative order in each section)
    for (int column_n = 0; column_n < table->FreezeColumnsRequest; column_n++)
    {
        int order_n = table->DisplayOrderToIndex[column_n];
        if (order_n != column_n && order_n >= table->FreezeColumnsRequest)
        {
            ImSwap(table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder, table->Columns[table->DisplayOrderToIndex[column_n]].DisplayOrder);
            ImSwap(table->DisplayOrderToIndex[order_n], table->DisplayOrderToIndex[column_n]);
        }
    }
}